

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O0

string * FIX::HttpMessage::createResponse(string *__return_storage_ptr__,int error,string *text)

{
  ostream *poVar1;
  stringstream local_1d8 [8];
  stringstream response;
  ostream local_1c8 [392];
  string local_40 [8];
  string errorString;
  string *text_local;
  int error_local;
  
  errorString.field_2._8_8_ = text;
  std::__cxx11::string::string(local_40);
  if (error == 100) {
    std::__cxx11::string::operator=(local_40,"Continue");
  }
  else if (error == 0x65) {
    std::__cxx11::string::operator=(local_40,"Switching Protocols");
  }
  else if (error == 200) {
    std::__cxx11::string::operator=(local_40,"OK");
  }
  else if (error == 0xc9) {
    std::__cxx11::string::operator=(local_40,"Created");
  }
  else if (error == 0xca) {
    std::__cxx11::string::operator=(local_40,"Accepted");
  }
  else if (error == 0xcb) {
    std::__cxx11::string::operator=(local_40,"Non-Authoritative Information");
  }
  else if (error == 0xcc) {
    std::__cxx11::string::operator=(local_40,"No Content");
  }
  else if (error == 0xcd) {
    std::__cxx11::string::operator=(local_40,"Reset Content");
  }
  else if (error == 0xce) {
    std::__cxx11::string::operator=(local_40,"Partial Content");
  }
  else if (error == 300) {
    std::__cxx11::string::operator=(local_40,"Multiple Choices");
  }
  else if (error == 0x12d) {
    std::__cxx11::string::operator=(local_40,"Moved Permanently");
  }
  else if (error == 0x12e) {
    std::__cxx11::string::operator=(local_40,"Found");
  }
  else if (error == 0x12f) {
    std::__cxx11::string::operator=(local_40,"See Other");
  }
  else if (error == 0x130) {
    std::__cxx11::string::operator=(local_40,"Not Modified");
  }
  else if (error == 0x131) {
    std::__cxx11::string::operator=(local_40,"Use Proxy");
  }
  else if (error == 0x133) {
    std::__cxx11::string::operator=(local_40,"Temporary Redirect");
  }
  else if (error == 400) {
    std::__cxx11::string::operator=(local_40,"Bad Request");
  }
  else if (error == 0x191) {
    std::__cxx11::string::operator=(local_40,"Unauthorized");
  }
  else if (error == 0x192) {
    std::__cxx11::string::operator=(local_40,"Payment Required");
  }
  else if (error == 0x193) {
    std::__cxx11::string::operator=(local_40,"Forbidden");
  }
  else if (error == 0x194) {
    std::__cxx11::string::operator=(local_40,"Not Found");
  }
  else if (error == 0x195) {
    std::__cxx11::string::operator=(local_40,"Method Not Allowed");
  }
  else if (error == 0x196) {
    std::__cxx11::string::operator=(local_40,"Not Acceptable");
  }
  else if (error == 0x197) {
    std::__cxx11::string::operator=(local_40,"Proxy Authentication Required");
  }
  else if (error == 0x198) {
    std::__cxx11::string::operator=(local_40,"Request Timeout");
  }
  else if (error == 0x199) {
    std::__cxx11::string::operator=(local_40,"Conflict");
  }
  else if (error == 0x19a) {
    std::__cxx11::string::operator=(local_40,"Gone");
  }
  else if (error == 0x19b) {
    std::__cxx11::string::operator=(local_40,"Length Required");
  }
  else if (error == 0x19c) {
    std::__cxx11::string::operator=(local_40,"Precondition Failed");
  }
  else if (error == 0x19d) {
    std::__cxx11::string::operator=(local_40,"Request Entity Too Large");
  }
  else if (error == 0x19e) {
    std::__cxx11::string::operator=(local_40,"Request-URI Too Large");
  }
  else if (error == 0x19f) {
    std::__cxx11::string::operator=(local_40,"Unsupported Media Type");
  }
  else if (error == 0x1a0) {
    std::__cxx11::string::operator=(local_40,"Requested Range Not Satisfiable");
  }
  else if (error == 0x1a1) {
    std::__cxx11::string::operator=(local_40,"Expectation Failed");
  }
  else if (error == 500) {
    std::__cxx11::string::operator=(local_40,"Internal Server Error");
  }
  else if (error == 0x1f5) {
    std::__cxx11::string::operator=(local_40,"Not Implemented");
  }
  else if (error == 0x1f6) {
    std::__cxx11::string::operator=(local_40,"Bad Gateway");
  }
  else if (error == 0x1f7) {
    std::__cxx11::string::operator=(local_40,"Service Unavailable");
  }
  else if (error == 0x1f8) {
    std::__cxx11::string::operator=(local_40,"Gateway Timeout");
  }
  else if (error == 0x1f9) {
    std::__cxx11::string::operator=(local_40,"HTTP Version not supported");
  }
  else {
    std::__cxx11::string::operator=(local_40,"Unknown");
  }
  std::__cxx11::stringstream::stringstream(local_1d8);
  poVar1 = std::operator<<(local_1c8,"HTTP/1.1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,error);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(poVar1,"Server: QuickFIX");
  poVar1 = std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(poVar1,"Content-Type: text/html; charset=iso-8859-1");
  poVar1 = std::operator<<(poVar1,"\r\n\r\n");
  std::operator<<(poVar1,"<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">");
  if ((error < 200) || (299 < error)) {
    poVar1 = std::operator<<(local_1c8,"<HTML><HEAD><TITLE>");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,error);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,local_40);
    poVar1 = std::operator<<(poVar1,"</TITLE></HEAD><BODY>");
    poVar1 = std::operator<<(poVar1,"<H1>");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,error);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,local_40);
    poVar1 = std::operator<<(poVar1,"</H1>");
    poVar1 = std::operator<<(poVar1,(string *)errorString.field_2._8_8_);
    std::operator<<(poVar1,"</BODY></HTML>");
  }
  else {
    std::operator<<(local_1c8,(string *)errorString.field_2._8_8_);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpMessage::createResponse(int error, const std::string &text) {
  std::string errorString;
  switch (error) {
  case 100:
    errorString = "Continue";
    break;
  case 101:
    errorString = "Switching Protocols";
    break;
  case 200:
    errorString = "OK";
    break;
  case 201:
    errorString = "Created";
    break;
  case 202:
    errorString = "Accepted";
    break;
  case 203:
    errorString = "Non-Authoritative Information";
    break;
  case 204:
    errorString = "No Content";
    break;
  case 205:
    errorString = "Reset Content";
    break;
  case 206:
    errorString = "Partial Content";
    break;
  case 300:
    errorString = "Multiple Choices";
    break;
  case 301:
    errorString = "Moved Permanently";
    break;
  case 302:
    errorString = "Found";
    break;
  case 303:
    errorString = "See Other";
    break;
  case 304:
    errorString = "Not Modified";
    break;
  case 305:
    errorString = "Use Proxy";
    break;
  case 307:
    errorString = "Temporary Redirect";
    break;
  case 400:
    errorString = "Bad Request";
    break;
  case 401:
    errorString = "Unauthorized";
    break;
  case 402:
    errorString = "Payment Required";
    break;
  case 403:
    errorString = "Forbidden";
    break;
  case 404:
    errorString = "Not Found";
    break;
  case 405:
    errorString = "Method Not Allowed";
    break;
  case 406:
    errorString = "Not Acceptable";
    break;
  case 407:
    errorString = "Proxy Authentication Required";
    break;
  case 408:
    errorString = "Request Timeout";
    break;
  case 409:
    errorString = "Conflict";
    break;
  case 410:
    errorString = "Gone";
    break;
  case 411:
    errorString = "Length Required";
    break;
  case 412:
    errorString = "Precondition Failed";
    break;
  case 413:
    errorString = "Request Entity Too Large";
    break;
  case 414:
    errorString = "Request-URI Too Large";
    break;
  case 415:
    errorString = "Unsupported Media Type";
    break;
  case 416:
    errorString = "Requested Range Not Satisfiable";
    break;
  case 417:
    errorString = "Expectation Failed";
    break;
  case 500:
    errorString = "Internal Server Error";
    break;
  case 501:
    errorString = "Not Implemented";
    break;
  case 502:
    errorString = "Bad Gateway";
    break;
  case 503:
    errorString = "Service Unavailable";
    break;
  case 504:
    errorString = "Gateway Timeout";
    break;
  case 505:
    errorString = "HTTP Version not supported";
    break;
  default:
    errorString = "Unknown";
  }

  std::stringstream response;
  response << "HTTP/1.1 " << error << " " << errorString << "\r\n"
           << "Server: QuickFIX" << "\r\n"
           << "Content-Type: text/html; charset=iso-8859-1" << "\r\n\r\n"
           << "<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">";

  if (error < 200 || error >= 300) {
    response << "<HTML><HEAD><TITLE>" << error << " " << errorString << "</TITLE></HEAD><BODY>"
             << "<H1>" << error << " " << errorString << "</H1>" << text << "</BODY></HTML>";
  } else {
    response << text;
  }

  return response.str();
}